

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O0

bool __thiscall Finger::checkDists(Finger *this)

{
  double dVar1;
  bool local_69;
  Point_<int> local_5c;
  Point_<int> local_54;
  int d3;
  Point_<int> local_40;
  int local_38;
  int d2;
  Point_<int> local_2c;
  int local_24;
  int local_20;
  int d1;
  int maxDist;
  int minDist;
  Finger *this_local;
  
  if ((this->shouldCheckDist & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    d1 = (this->boundingBox).height / 5;
    local_20 = (int)((double)d1 * 3.5);
    _maxDist = this;
    cv::Point_<int>::Point_(&local_2c,&this->ptStart);
    cv::Point_<int>::Point_((Point_<int> *)&stack0xffffffffffffffcc,&this->ptFar);
    dVar1 = getDist(&local_2c,(Point *)&stack0xffffffffffffffcc);
    local_24 = (int)dVar1;
    cv::Point_<int>::Point_(&local_40,&this->ptEnd);
    cv::Point_<int>::Point_((Point_<int> *)&stack0xffffffffffffffb8,&this->ptFar);
    dVar1 = getDist(&local_40,(Point *)&stack0xffffffffffffffb8);
    local_38 = (int)dVar1;
    cv::Point_<int>::Point_(&local_54,&this->ptStart);
    cv::Point_<int>::Point_(&local_5c,&this->ptEnd);
    dVar1 = getDist(&local_54,&local_5c);
    local_69 = false;
    if ((d1 < local_24) && (local_69 = false, d1 < local_38)) {
      local_69 = (int)dVar1 < local_20;
    }
    this->ok = local_69;
    this_local._7_1_ = (bool)(this->ok & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Finger::checkDists() {
    if (!shouldCheckDist)
        return true;

    int minDist = boundingBox.height / 5;
    int maxDist = minDist * 3.5;

    int d1 = getDist(ptStart, ptFar);
    int d2 = getDist(ptEnd, ptFar);
    int d3 = getDist(ptStart, ptEnd);

    ok = (d1 > minDist && d2 > minDist)
         && (d3 < maxDist);
    return ok;
}